

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

char * read_file(char *filename,size_t *size)

{
  int iVar1;
  char *in_RAX;
  FILE *__stream;
  size_t __n;
  size_t sVar2;
  runtime_error *this;
  char *local_28;
  
  local_28 = in_RAX;
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"file open error");
  }
  else {
    fseek(__stream,0,2);
    __n = ftell(__stream);
    iVar1 = posix_memalign(&local_28,0x40,__n + 0xbf & 0xffffffffffffffc0);
    if ((iVar1 == 0) && (local_28 != (char *)0x0)) {
      rewind(__stream);
      sVar2 = fread(local_28,1,__n,__stream);
      if (sVar2 == __n) {
        fclose(__stream);
        local_28[__n] = '\0';
        *size = __n;
        return local_28;
      }
      free(__stream);
      fclose(__stream);
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"read data failed");
    }
    else {
      fclose(__stream);
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"allocate memory failed");
    }
  }
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

char *read_file(const char *filename, size_t *size) {
    std::FILE *pfile = std::fopen(filename, "rb");
    if (pfile == nullptr) throw std::runtime_error("file open error");
    std::fseek(pfile, 0, SEEK_END);
    size_t _size = std::ftell(pfile);
    char *buffer = aligned_malloc(_size + 2 * kAlignmentSize);
    if (buffer == nullptr) {
        std::fclose(pfile);
        throw std::runtime_error("allocate memory failed");
    }
    std::rewind(pfile);
    if (std::fread(buffer, 1, _size, pfile) != _size) {
        free(pfile);
        std::fclose(pfile);
        throw std::runtime_error("read data failed");
    }
    std::fclose(pfile);
    buffer[_size] = '\0';
    *size = _size;
    return buffer;
}